

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O1

int xmrig::NvmlLib::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined7 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  
  if (m_initialized == '\0') {
    String::copy((String *)&m_loader,ctx,in_RDX);
    bVar1 = dlopen();
    if (bVar1) {
      bVar1 = load();
      in_RAX = CONCAT71(extraout_var,bVar1);
    }
    else {
      in_RAX = 0;
    }
    m_ready = (undefined1)in_RAX;
    m_initialized = '\x01';
  }
  return (int)CONCAT71((int7)((ulong)in_RAX >> 8),m_ready);
}

Assistant:

bool xmrig::NvmlLib::init(const char *fileName)
{
    if (!m_initialized) {
        m_loader      = fileName;
        m_ready       = dlopen() && load();
        m_initialized = true;
    }

    return m_ready;
}